

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_vfs_unregister(sqlite3_vfs *pVfs)

{
  sqlite3_mutex *psVar1;
  
  if (sqlite3Config.bCoreMutex == 0) {
    psVar1 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar1 = (*sqlite3Config.mutex.xMutexAlloc)(2);
  }
  if (psVar1 == (sqlite3_mutex *)0x0) {
    vfsUnlink(pVfs);
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(psVar1);
    vfsUnlink(pVfs);
    (*sqlite3Config.mutex.xMutexLeave)(psVar1);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_vfs_unregister(sqlite3_vfs *pVfs){
#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
#endif
  sqlite3_mutex_enter(mutex);
  vfsUnlink(pVfs);
  sqlite3_mutex_leave(mutex);
  return SQLITE_OK;
}